

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthPrintProfile(uint *pTruth,int nVars)

{
  uint local_1c;
  uint local_18;
  uint uTruth [2];
  int nVars_local;
  uint *pTruth_local;
  
  uTruth[0] = nVars;
  unique0x1000009b = pTruth;
  if (nVars < 6) {
    if (nVars < 2) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                    ,0x8a3,"void Kit_TruthPrintProfile(unsigned int *, int)");
    }
    local_1c = *pTruth;
    local_18 = *pTruth;
    Kit_TruthPrintProfile(&local_1c,6);
  }
  else {
    Kit_TruthPrintProfile_int(pTruth,nVars);
  }
  return;
}

Assistant:

void Kit_TruthPrintProfile( unsigned * pTruth, int nVars )
{
    unsigned uTruth[2];
    if ( nVars >= 6 )
    {
        Kit_TruthPrintProfile_int( pTruth, nVars );
        return;
    }
    assert( nVars >= 2 );
    uTruth[0] = pTruth[0];
    uTruth[1] = pTruth[0];
    Kit_TruthPrintProfile( uTruth, 6 );
}